

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseLocator_test.cpp
# Opt level: O2

void __thiscall test::external_definition::test_method(external_definition *this)

{
  bool bVar1;
  allocator local_1449;
  string licenseRealContent;
  shared_count sStack_1418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseInfos;
  string currentLocation;
  string referenceContent;
  string applicationDefinedString;
  undefined **local_1398;
  char *local_1390;
  undefined1 *local_1388;
  char *local_1380;
  ExternalDefinition externalDefinition;
  char *local_1328;
  char *local_1320;
  char *local_1318;
  char *local_1310;
  undefined1 *local_1308;
  undefined1 *local_1300;
  char *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12e0;
  undefined1 *local_12d8;
  undefined1 *local_12d0;
  char *local_12c8;
  char *local_12c0;
  char *local_12b8;
  char *local_12b0;
  undefined1 *local_12a8;
  undefined1 *local_12a0;
  char *local_1298;
  char *local_1290;
  EventRegistry registry;
  ifstream src;
  undefined8 auStack_1150 [36];
  LicenseLocation licLocation;
  
  std::__cxx11::string::string
            ((string *)&applicationDefinedString,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/test_reader.ini;/this/one/doesnt/exist"
             ,(allocator *)&licLocation);
  std::ifstream::ifstream
            (&src,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/test_reader.ini"
             ,_S_bin);
  referenceContent._M_dataplus._M_p = (pointer)&referenceContent.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&referenceContent,
             *(undefined8 *)((long)auStack_1150 + *(long *)(_src + -0x18)),0xffffffffffffffff,0,
             0xffffffff);
  license::EventRegistry::EventRegistry(&registry);
  memset(&licLocation,0,0x1004);
  if (applicationDefinedString._M_string_length != 0) {
    memmove(licLocation.licenseData,applicationDefinedString._M_dataplus._M_p,
            applicationDefinedString._M_string_length);
  }
  license::locate::ExternalDefinition::ExternalDefinition(&externalDefinition,&licLocation);
  license::locate::ExternalDefinition::license_locations_abi_cxx11_
            (&licenseInfos,&externalDefinition,&registry);
  local_1298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_1290 = "";
  local_12a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1298,0x66);
  bVar1 = license::EventRegistry::isGood(&registry);
  licenseRealContent._M_dataplus._M_p._0_1_ = bVar1;
  licenseRealContent._M_string_length = 0;
  licenseRealContent.field_2._M_allocated_capacity = 0;
  currentLocation.field_2._8_8_ = &local_1398;
  local_1398 = (undefined **)0x1b01e8;
  local_1390 = "";
  currentLocation._M_string_length._0_1_ = 0;
  currentLocation._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001e2110;
  currentLocation.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_12b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_12b0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&licenseRealContent,&currentLocation,&local_12b8,0x66,1,0,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&licenseRealContent.field_2._M_allocated_capacity);
  local_12c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_12c0 = "";
  local_12d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_12c8,0x67);
  currentLocation._M_string_length._0_1_ = 0;
  currentLocation._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001e2150;
  currentLocation.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  currentLocation.field_2._8_8_ = anon_var_dwarf_a7e7;
  local_12e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_12e0 = "";
  local_1398 = (undefined **)CONCAT44(local_1398._4_4_,1);
  licenseRealContent._M_dataplus._M_p =
       (pointer)((long)licenseInfos.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)licenseInfos.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
            (&currentLocation,&local_12e8,0x67,1,2,&local_1398,"1",&licenseRealContent,
             "licenseInfos.size()");
  std::__cxx11::string::string
            ((string *)&currentLocation,
             (string *)
             licenseInfos.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_12f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_12f0 = "";
  local_1308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_12f8,0x69);
  std::__cxx11::string::string
            ((string *)&licenseRealContent,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/test_reader.ini"
             ,&local_1449);
  std::__cxx11::string::compare((string *)&licenseRealContent);
  sStack_1418.pi_ = (sp_counted_base *)0x0;
  local_1390 = (char *)((ulong)local_1390 & 0xffffffffffffff00);
  local_1398 = &PTR__lazy_ostream_001e2250;
  local_1388 = boost::unit_test::lazy_ostream::inst;
  local_1380 = "file found at expected location";
  local_1318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_1310 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1418);
  std::__cxx11::string::~string((string *)&licenseRealContent);
  license::locate::ExternalDefinition::retrieve_license_content
            (&licenseRealContent,&externalDefinition,&currentLocation);
  local_1328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_1320 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1328,0x6b);
  std::__cxx11::string::compare((string *)&referenceContent);
  sStack_1418.pi_ = (sp_counted_base *)0x0;
  local_1390 = (char *)((ulong)local_1390 & 0xffffffffffffff00);
  local_1398 = &PTR__lazy_ostream_001e2210;
  local_1388 = boost::unit_test::lazy_ostream::inst;
  local_1380 = "File content is same";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1418);
  std::__cxx11::string::~string((string *)&licenseRealContent);
  std::__cxx11::string::~string((string *)&currentLocation);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&licenseInfos);
  license::locate::ExternalDefinition::~ExternalDefinition(&externalDefinition);
  license::EventRegistry::~EventRegistry(&registry);
  std::__cxx11::string::~string((string *)&referenceContent);
  std::ifstream::~ifstream(&src);
  std::__cxx11::string::~string((string *)&applicationDefinedString);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_definition) {
	// an application can define multiple license locations separated by ';'
	string applicationDefinedString = MOCK_LICENSE ";/this/one/doesnt/exist";

	// read test license
	std::ifstream src(MOCK_LICENSE, std::ios::binary);
	std::string referenceContent((std::istreambuf_iterator<char>(src)), std::istreambuf_iterator<char>());
	license::EventRegistry registry;
	LicenseLocation licLocation = {LICENSE_PATH};
	std::copy(applicationDefinedString.begin(), applicationDefinedString.end(), licLocation.licenseData);
	ExternalDefinition externalDefinition(&licLocation);
	vector<string> licenseInfos = externalDefinition.license_locations(registry);
	BOOST_CHECK(registry.isGood());
	BOOST_CHECK_EQUAL(1, licenseInfos.size());
	string currentLocation = licenseInfos[0];
	BOOST_CHECK_MESSAGE(string(MOCK_LICENSE).compare(currentLocation) == 0, "file found at expected location");
	string licenseRealContent = externalDefinition.retrieve_license_content(currentLocation);
	BOOST_CHECK_MESSAGE(referenceContent.compare(licenseRealContent) == 0, "File content is same");
}